

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallFilesGenerator::GenerateScriptActions
          (cmInstallFilesGenerator *this,ostream *os,Indent *indent)

{
  allocator local_41;
  string local_40;
  Indent *local_20;
  Indent *indent_local;
  ostream *os_local;
  cmInstallFilesGenerator *this_local;
  
  local_20 = indent;
  indent_local = (Indent *)os;
  os_local = (ostream *)this;
  if (((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"",&local_41);
    AddFilesInstallRule(this,os,&local_40,local_20,&this->Files);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  else {
    cmScriptGenerator::GenerateScriptActions((cmScriptGenerator *)this,os,indent);
  }
  return;
}

Assistant:

void cmInstallFilesGenerator::GenerateScriptActions(std::ostream& os,
                                                    Indent const& indent)
{
  if(this->ActionsPerConfig)
    {
    this->cmInstallGenerator::GenerateScriptActions(os, indent);
    }
  else
    {
    this->AddFilesInstallRule(os, "", indent, this->Files);
    }
}